

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxdantzigpr.hpp
# Opt level: O3

SPxId __thiscall
soplex::
SPxDantzigPR<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::selectEnterX(SPxDantzigPR<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               *this)

{
  undefined8 uVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  int iVar5;
  DataKey DVar6;
  DataKey *pDVar7;
  SPxId enterId;
  SPxId enterIdCo;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  result;
  DataKey local_108;
  DataKey local_100;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_f8;
  cpp_dec_float<50U,_int,_void> local_c0;
  cpp_dec_float<50U,_int,_void> local_88;
  cpp_dec_float<50U,_int,_void> local_48;
  
  local_108.info = 0;
  local_108.idx = -1;
  local_100.info = 0;
  local_100.idx = -1;
  local_f8.m_backend.data._M_elems[0] =
       (this->
       super_SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
       ).thetolerance.m_backend.data._M_elems[0];
  local_c0.data._M_elems[9] =
       (this->
       super_SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
       ).thetolerance.m_backend.data._M_elems[9];
  local_c0.data._M_elems._20_8_ =
       *(undefined8 *)
        ((this->
         super_SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
         ).thetolerance.m_backend.data._M_elems + 5);
  local_c0.data._M_elems._28_8_ =
       *(undefined8 *)
        ((this->
         super_SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
         ).thetolerance.m_backend.data._M_elems + 7);
  local_c0.data._M_elems._4_8_ =
       *(undefined8 *)
        ((this->
         super_SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
         ).thetolerance.m_backend.data._M_elems + 1);
  local_c0.data._M_elems._12_8_ =
       *(undefined8 *)
        ((this->
         super_SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
         ).thetolerance.m_backend.data._M_elems + 3);
  local_f8.m_backend.exp =
       (this->
       super_SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
       ).thetolerance.m_backend.exp;
  local_f8.m_backend.fpclass =
       (this->
       super_SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
       ).thetolerance.m_backend.fpclass;
  local_f8.m_backend.neg =
       (bool)((local_f8.m_backend.data._M_elems[0] != 0 ||
              local_f8.m_backend.fpclass != cpp_dec_float_finite) ^
             (this->
             super_SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             ).thetolerance.m_backend.neg);
  local_f8.m_backend.prec_elem =
       (this->
       super_SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
       ).thetolerance.m_backend.prec_elem;
  uVar1 = *(undefined8 *)
           ((this->
            super_SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
            ).thetolerance.m_backend.data._M_elems + 1);
  uVar2 = *(undefined8 *)
           ((this->
            super_SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
            ).thetolerance.m_backend.data._M_elems + 3);
  uVar3 = *(undefined8 *)
           ((this->
            super_SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
            ).thetolerance.m_backend.data._M_elems + 5);
  uVar4 = *(undefined8 *)
           ((this->
            super_SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
            ).thetolerance.m_backend.data._M_elems + 7);
  local_f8.m_backend.data._M_elems[1] = (uint)uVar1;
  local_f8.m_backend.data._M_elems[2] = (uint)((ulong)uVar1 >> 0x20);
  local_f8.m_backend.data._M_elems[3] = (uint)uVar2;
  local_f8.m_backend.data._M_elems[4] = (uint)((ulong)uVar2 >> 0x20);
  local_f8.m_backend.data._M_elems[5] = (uint)uVar3;
  local_f8.m_backend.data._M_elems[6] = (uint)((ulong)uVar3 >> 0x20);
  local_f8.m_backend.data._M_elems[7] = (uint)uVar4;
  local_f8.m_backend.data._M_elems[8] = (uint)((ulong)uVar4 >> 0x20);
  local_f8.m_backend.data._M_elems[9] =
       (this->
       super_SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
       ).thetolerance.m_backend.data._M_elems[9];
  local_c0.data._M_elems[0] = local_f8.m_backend.data._M_elems[0];
  local_c0.exp = local_f8.m_backend.exp;
  local_c0.neg = local_f8.m_backend.neg;
  local_c0.fpclass = local_f8.m_backend.fpclass;
  local_c0.prec_elem = local_f8.m_backend.prec_elem;
  if (((this->
       super_SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
       ).thesolver)->sparsePricingEnter == true) {
    local_108 = (DataKey)selectEnterSparseDim
                                   (this,(number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                          *)&local_c0,(SPxId *)&local_108);
  }
  else {
    local_108 = (DataKey)selectEnterDenseDim(this,(
                                                  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                                  *)&local_c0,(SPxId *)&local_108);
  }
  if (((this->
       super_SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
       ).thesolver)->sparsePricingEnterCo == true) {
    DVar6 = (DataKey)selectEnterSparseCoDim(this,&local_f8,(SPxId *)&local_108);
  }
  else {
    DVar6 = (DataKey)selectEnterDenseCoDim(this,&local_f8,(SPxId *)&local_108);
  }
  local_100 = DVar6;
  if (local_108.info != 0) {
    local_48.fpclass = cpp_dec_float_finite;
    local_48.prec_elem = 10;
    local_48.data._M_elems[0] = 0;
    local_48.data._M_elems[1] = 0;
    local_48.data._M_elems[2] = 0;
    local_48.data._M_elems[3] = 0;
    local_48.data._M_elems[4] = 0;
    local_48.data._M_elems[5] = 0;
    local_48.data._M_elems._24_5_ = 0;
    local_48.data._M_elems[7]._1_3_ = 0;
    local_48.data._M_elems._32_5_ = 0;
    local_48._37_8_ = 0;
    boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
              ((cpp_dec_float<50u,int,void> *)&local_48,0.8);
    local_88.data._M_elems[1] = local_f8.m_backend.data._M_elems[1];
    local_88.data._M_elems[0] = local_f8.m_backend.data._M_elems[0];
    local_88.data._M_elems[3] = local_f8.m_backend.data._M_elems[3];
    local_88.data._M_elems[2] = local_f8.m_backend.data._M_elems[2];
    local_88.data._M_elems[5] = local_f8.m_backend.data._M_elems[5];
    local_88.data._M_elems[4] = local_f8.m_backend.data._M_elems[4];
    local_88.data._M_elems[7] = local_f8.m_backend.data._M_elems[7];
    local_88.data._M_elems[6] = local_f8.m_backend.data._M_elems[6];
    local_88.data._M_elems[9] = local_f8.m_backend.data._M_elems[9];
    local_88.data._M_elems[8] = local_f8.m_backend.data._M_elems[8];
    local_88.exp = local_f8.m_backend.exp;
    local_88.neg = local_f8.m_backend.neg;
    local_88.prec_elem = local_f8.m_backend.prec_elem;
    local_88.fpclass = local_f8.m_backend.fpclass;
    boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator*=(&local_88,&local_48);
    if ((((local_c0.fpclass != cpp_dec_float_NaN) && (local_88.fpclass != cpp_dec_float_NaN)) &&
        (iVar5 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                           (&local_c0,&local_88), pDVar7 = &local_108, 0 < iVar5)) ||
       (pDVar7 = &local_108, DVar6.info == 0)) goto LAB_002a24a9;
  }
  pDVar7 = &local_100;
LAB_002a24a9:
  return (SPxId)*pDVar7;
}

Assistant:

SPxId SPxDantzigPR<R>::selectEnterX()
{
   SPxId enterId;
   SPxId enterIdCo;
   R best;
   R bestCo;

   best = -this->thetolerance;
   bestCo = -this->thetolerance;
   enterId = (this->thesolver->sparsePricingEnter) ? selectEnterSparseDim(best,
             enterId) : selectEnterDenseDim(best, enterId);
   enterIdCo = (this->thesolver->sparsePricingEnterCo) ? selectEnterSparseCoDim(bestCo,
               enterId) : selectEnterDenseCoDim(bestCo, enterId);

   // prefer slack indices to reduce nonzeros in basis matrix
   if(enterId.isValid() && (best > SOPLEX_SPARSITY_TRADEOFF * bestCo || !enterIdCo.isValid()))
      return enterId;
   else
      return enterIdCo;
}